

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

void rw::ps2::writeNativeTexture(Texture *tex,Stream *stream)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  Raster *pRVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  uint8 *puVar7;
  long lVar8;
  int32 local_70;
  int32 local_6c;
  int local_68;
  ushort local_64;
  short local_62;
  undefined8 local_60;
  undefined4 local_58;
  uint local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  uint local_34;
  
  pRVar4 = tex->raster;
  lVar8 = (long)nativeRasterOffset;
  writeChunkHeader(stream,1,8);
  Stream::writeU32(stream,0x325350);
  Stream::writeU32(stream,tex->filterAddressing);
  sVar5 = strlen(tex->name);
  uVar3 = ((uint)sVar5 & 0xfffffffc) + 4;
  writeChunkHeader(stream,2,uVar3);
  (*stream->_vptr_Stream[3])(stream,tex->name,(ulong)uVar3);
  sVar5 = strlen(tex->mask);
  uVar3 = ((uint)sVar5 & 0xfffffffc) + 4;
  writeChunkHeader(stream,2,uVar3);
  (*stream->_vptr_Stream[3])(stream,tex->mask,(ulong)uVar3);
  iVar2 = *(int *)((long)&pRVar4->stride + lVar8);
  uVar3 = *(int *)(&pRVar4->field_0x24 + lVar8) + iVar2;
  writeChunkHeader(stream,1,*(int *)(&pRVar4->field_0x24 + lVar8) + iVar2 + 0x58);
  writeChunkHeader(stream,1,0x40);
  local_70 = pRVar4->width;
  local_6c = pRVar4->height;
  local_68 = pRVar4->depth;
  local_64 = (ushort)pRVar4->type | (ushort)pRVar4->format;
  local_62 = 0;
  bVar1 = *(byte *)((long)&pRVar4->pixels + lVar8 + 4);
  if (local_68 == 8 && bVar1 == 2 || (bVar1 & 1) != 0) {
    local_62 = (bVar1 & 1) + 1;
  }
  local_60 = *(undefined8 *)((long)&pRVar4->platform + lVar8);
  local_58 = *(undefined4 *)((long)&pRVar4->flags + lVar8);
  local_54 = (uint)*(byte *)((long)&pRVar4->privateFlags + lVar8 + 2);
  local_50 = *(undefined8 *)((long)&pRVar4->format + lVar8);
  local_48 = *(undefined8 *)((long)&pRVar4->height + lVar8);
  local_40 = *(undefined4 *)((long)&pRVar4->stride + lVar8);
  local_3c = *(undefined4 *)(&pRVar4->field_0x24 + lVar8);
  local_38 = *(undefined4 *)((long)&pRVar4->pixels + lVar8);
  local_34 = (uint)*(ushort *)((long)&pRVar4->privateFlags + lVar8);
  (*stream->_vptr_Stream[3])(stream,&local_70,0x40);
  writeChunkHeader(stream,1,uVar3);
  if (local_62 < 2) {
    puVar7 = pRVar4->pixels;
    pp_Var6 = stream->_vptr_Stream;
  }
  else {
    (*stream->_vptr_Stream[3])
              (stream,*(undefined8 *)pRVar4->originalPixels,
               (ulong)*(uint *)((long)&pRVar4->stride + lVar8));
    puVar7 = pRVar4->palette + -0x50;
    uVar3 = *(uint *)(&pRVar4->field_0x24 + lVar8);
    pp_Var6 = stream->_vptr_Stream;
  }
  (*pp_Var6[3])(stream,puVar7,(ulong)uVar3);
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	Raster *raster = tex->raster;
	Ps2Raster *ras = GETPS2RASTEREXT(raster);
	writeChunkHeader(stream, ID_STRUCT, 8);
	stream->writeU32(FOURCC_PS2);
	stream->writeU32(tex->filterAddressing);
	int32 len = strlen(tex->name)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, len);
	stream->write8(tex->name, len);
	len = strlen(tex->mask)+4 & ~3;
	writeChunkHeader(stream, ID_STRING, len);
	stream->write8(tex->mask, len);

	int32 sz = ras->pixelSize + ras->paletteSize;
	writeChunkHeader(stream, ID_STRUCT, 12 + 64 + 12 + sz);
	writeChunkHeader(stream, ID_STRUCT, 64);
	StreamRasterExt streamExt;
	streamExt.width = raster->width;
	streamExt.height = raster->height;
	streamExt.depth = raster->depth;
	streamExt.rasterFormat = raster->format | raster->type;
	streamExt.version = 0;
	if(ras->flags == Ps2Raster::SWIZZLED8 && raster->depth == 8)
		streamExt.version = 1;
	if(ras->flags & Ps2Raster::NEWSTYLE)
		streamExt.version = 2;
	streamExt.tex0 = ras->tex0;
	streamExt.paletteOffset = ras->paletteBase;
	streamExt.tex1low = ras->tex1low;
	streamExt.miptbp1 = ras->miptbp1;
	streamExt.miptbp2 = ras->miptbp2;
	streamExt.pixelSize = ras->pixelSize;
	streamExt.paletteSize = ras->paletteSize;
	streamExt.totalSize = ras->totalSize;
	streamExt.mipmapVal = ras->kl;
	ASSERTLITTLE;
	stream->write8(&streamExt, 64);

	writeChunkHeader(stream, ID_STRUCT, sz);
	if(streamExt.version < 2){
		stream->write8(raster->pixels, sz);
	}else{
		stream->write8(((Ps2Raster::PixelPtr*)raster->originalPixels)->pixels, ras->pixelSize);
		stream->write8(raster->palette-0x50, ras->paletteSize);
	}
}